

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::count::~count(count *this)

{
  ostream *poVar1;
  allocator local_71;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  char local_60 [8];
  undefined8 uStack_58;
  text local_50;
  text local_30;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->n);
  poVar1 = std::operator<<(poVar1," selected ");
  std::__cxx11::string::string((string *)&local_70,"test",&local_71);
  local_50._M_string_length = local_68;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  if (local_70 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60) {
    local_50.field_2._8_8_ = uStack_58;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)local_70;
  }
  local_68 = 0;
  local_60[0] = '\0';
  local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_60;
  pluralise(&local_30,&local_50,this->n);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

~count()
    {
        os << n << " selected " << pluralise("test", n) << "\n";
    }